

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

void prepare_half_coeffs_6tap_avx2
               (InterpFilterParams *filter_params,int32_t subpel_q4,__m256i *coeffs)

{
  undefined1 auVar1 [16];
  undefined2 uVar2;
  undefined1 auVar3 [16];
  
  auVar3 = vpsraw_avx(*(undefined1 (*) [16])
                       (filter_params->filter_ptr + (uint)filter_params->taps * (subpel_q4 & 0xfU)),
                      1);
  auVar1 = vpshufb_avx(auVar3,_DAT_004c4940);
  uVar2 = auVar1._0_2_;
  *(undefined2 *)*coeffs = uVar2;
  *(undefined2 *)((long)*coeffs + 2) = uVar2;
  *(undefined2 *)((long)*coeffs + 4) = uVar2;
  *(undefined2 *)((long)*coeffs + 6) = uVar2;
  *(undefined2 *)(*coeffs + 1) = uVar2;
  *(undefined2 *)((long)*coeffs + 10) = uVar2;
  *(undefined2 *)((long)*coeffs + 0xc) = uVar2;
  *(undefined2 *)((long)*coeffs + 0xe) = uVar2;
  *(undefined2 *)(*coeffs + 2) = uVar2;
  *(undefined2 *)((long)*coeffs + 0x12) = uVar2;
  *(undefined2 *)((long)*coeffs + 0x14) = uVar2;
  *(undefined2 *)((long)*coeffs + 0x16) = uVar2;
  *(undefined2 *)(*coeffs + 3) = uVar2;
  *(undefined2 *)((long)*coeffs + 0x1a) = uVar2;
  *(undefined2 *)((long)*coeffs + 0x1c) = uVar2;
  *(undefined2 *)((long)*coeffs + 0x1e) = uVar2;
  auVar1 = vpshufb_avx(auVar3,_DAT_004c4950);
  uVar2 = auVar1._0_2_;
  *(undefined2 *)coeffs[1] = uVar2;
  *(undefined2 *)((long)coeffs[1] + 2) = uVar2;
  *(undefined2 *)((long)coeffs[1] + 4) = uVar2;
  *(undefined2 *)((long)coeffs[1] + 6) = uVar2;
  *(undefined2 *)(coeffs[1] + 1) = uVar2;
  *(undefined2 *)((long)coeffs[1] + 10) = uVar2;
  *(undefined2 *)((long)coeffs[1] + 0xc) = uVar2;
  *(undefined2 *)((long)coeffs[1] + 0xe) = uVar2;
  *(undefined2 *)(coeffs[1] + 2) = uVar2;
  *(undefined2 *)((long)coeffs[1] + 0x12) = uVar2;
  *(undefined2 *)((long)coeffs[1] + 0x14) = uVar2;
  *(undefined2 *)((long)coeffs[1] + 0x16) = uVar2;
  *(undefined2 *)(coeffs[1] + 3) = uVar2;
  *(undefined2 *)((long)coeffs[1] + 0x1a) = uVar2;
  *(undefined2 *)((long)coeffs[1] + 0x1c) = uVar2;
  *(undefined2 *)((long)coeffs[1] + 0x1e) = uVar2;
  auVar1 = vpshufb_avx(auVar3,_DAT_004c4960);
  uVar2 = auVar1._0_2_;
  *(undefined2 *)coeffs[2] = uVar2;
  *(undefined2 *)((long)coeffs[2] + 2) = uVar2;
  *(undefined2 *)((long)coeffs[2] + 4) = uVar2;
  *(undefined2 *)((long)coeffs[2] + 6) = uVar2;
  *(undefined2 *)(coeffs[2] + 1) = uVar2;
  *(undefined2 *)((long)coeffs[2] + 10) = uVar2;
  *(undefined2 *)((long)coeffs[2] + 0xc) = uVar2;
  *(undefined2 *)((long)coeffs[2] + 0xe) = uVar2;
  *(undefined2 *)(coeffs[2] + 2) = uVar2;
  *(undefined2 *)((long)coeffs[2] + 0x12) = uVar2;
  *(undefined2 *)((long)coeffs[2] + 0x14) = uVar2;
  *(undefined2 *)((long)coeffs[2] + 0x16) = uVar2;
  *(undefined2 *)(coeffs[2] + 3) = uVar2;
  *(undefined2 *)((long)coeffs[2] + 0x1a) = uVar2;
  *(undefined2 *)((long)coeffs[2] + 0x1c) = uVar2;
  *(undefined2 *)((long)coeffs[2] + 0x1e) = uVar2;
  return;
}

Assistant:

static inline void prepare_half_coeffs_6tap_avx2(
    const InterpFilterParams *const filter_params, const int32_t subpel_q4,
    __m256i *const coeffs /* [3] */) {
  const int16_t *const filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);
  const __m128i coeffs_8 = _mm_loadu_si128((__m128i *)filter);

  // right shift all filter co-efficients by 1 to reduce the bits required.
  // This extra right shift will be taken care of at the end while rounding
  // the result.
  // Since all filter co-efficients are even, this change will not affect the
  // end result
  assert(_mm_test_all_zeros(_mm_and_si128(coeffs_8, _mm_set1_epi16(1)),
                            _mm_set1_epi16((short)0xffff)));
  const __m128i coeffs_1 = _mm_srai_epi16(coeffs_8, 1);
  populate_coeffs_6tap_avx2(coeffs_1, coeffs);
}